

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_se(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  internal_state_conflict *piVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  internal_state_conflict *state;
  size_t sVar6;
  uint uVar7;
  
  piVar1 = strm->state;
  if ((strm->avail_in < (ulong)piVar1->in_blklen) || (strm->avail_out < (ulong)piVar1->out_blklen))
  {
    piVar1->mode = m_se_decode;
    piVar1->sample_counter = piVar1->ref;
  }
  else {
    for (uVar7 = piVar1->ref; uVar7 < strm->block_size; uVar7 = uVar7 + 1) {
      uVar3 = direct_get_fs(strm);
      if (0x5a < uVar3) {
        return -1;
      }
      uVar5 = uVar3 - piVar1->se_table[(ulong)uVar3 * 2 + 1];
      piVar2 = strm->state;
      if ((uVar7 & 1) == 0) {
        puVar4 = piVar2->rsip;
        *puVar4 = piVar1->se_table[uVar3 * 2] - uVar5;
        puVar4 = puVar4 + 1;
        sVar6 = strm->avail_out - (ulong)piVar2->bytes_per_sample;
        uVar7 = uVar7 | 1;
      }
      else {
        puVar4 = piVar2->rsip;
        sVar6 = strm->avail_out;
      }
      piVar2->rsip = puVar4 + 1;
      *puVar4 = uVar5;
      strm->avail_out = sVar6 - piVar2->bytes_per_sample;
    }
    piVar1->mode = m_next_cds;
  }
  return 1;
}

Assistant:

static int m_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (BUFFERSPACE(strm)) {
        uint32_t i = state->ref;

        while (i < strm->block_size) {
            uint32_t m = direct_get_fs(strm);
            int32_t d1;

            if (m > SE_TABLE_SIZE)
                return M_ERROR;

            d1 = m - state->se_table[2 * m + 1];

            if ((i & 1) == 0) {
                put_sample(strm, state->se_table[2 * m] - d1);
                i++;
            }
            put_sample(strm, d1);
            i++;
        }
        state->mode = m_next_cds;
    } else {
        state->mode = m_se_decode;
        state->sample_counter = state->ref;
    }
    return M_CONTINUE;
}